

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_status_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::provider::ProviderStatusTest_test_to_string_Test::TestBody
          (ProviderStatusTest_test_to_string_Test *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ptr_ = local_28.ptr_ & 0xffffffff00000000;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_18,"\"READY\"","provider_status_map[Provider::Status::READY]",
             (char (*) [6])"READY",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_._0_4_ = 2;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (local_18,"\"DOWN\"","provider_status_map[Provider::Status::DOWN]",(char (*) [5])"DOWN",
             pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_._0_4_ = 5;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_18,"\"CLOSED\"","provider_status_map[Provider::Status::CLOSED]",
             (char (*) [7])"CLOSED",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_._0_4_ = 3;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            (local_18,"\"UNAVAILABLE\"","provider_status_map[Provider::Status::UNAVAILABLE]",
             (char (*) [12])"UNAVAILABLE",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_._0_4_ = 1;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_18,"\"DISABLED\"","provider_status_map[Provider::Status::DISABLED]",
             (char (*) [9])"DISABLED",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_._0_4_ = 4;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_18,"\"INVALID\"","provider_status_map[Provider::Status::INVALID]",
             (char (*) [8])"INVALID",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(ProviderStatusTest, test_to_string)
{
    EXPECT_EQ("READY", provider_status_map[Provider::Status::READY]);
    EXPECT_EQ("DOWN", provider_status_map[Provider::Status::DOWN]);
    EXPECT_EQ("CLOSED", provider_status_map[Provider::Status::CLOSED]);
    EXPECT_EQ("UNAVAILABLE", provider_status_map[Provider::Status::UNAVAILABLE]);
    EXPECT_EQ("DISABLED", provider_status_map[Provider::Status::DISABLED]);
    EXPECT_EQ("INVALID", provider_status_map[Provider::Status::INVALID]);
}